

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::generatePerQuad
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 InputType type,GLValue min,GLValue max)

{
  char *pcVar1;
  Half min_00;
  Half max_00;
  
  min_00.m_value = min.field_1._0_2_;
  max_00.m_value = max.field_1._0_2_;
  switch(type) {
  case INPUTTYPE_FLOAT:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                       (seed,count,componentCount,stride,primitive,min.field_1.fl.m_value,
                        max.field_1.fl.m_value);
    return pcVar1;
  case INPUTTYPE_FIXED:
    pcVar1 = createPerQuads<deqp::gls::GLValue::Fixed>
                       (seed,count,componentCount,stride,primitive,min.field_1.fi.m_value,
                        max.field_1.fi.m_value);
    break;
  case INPUTTYPE_DOUBLE:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                       (seed,count,componentCount,stride,primitive,min.field_1.d,max.field_1.d);
    return pcVar1;
  case INPUTTYPE_BYTE:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                       (seed,count,componentCount,stride,primitive,
                        (WrappedType<signed_char>)min.field_1._0_1_,
                        (WrappedType<signed_char>)max.field_1._0_1_);
    break;
  case INPUTTYPE_SHORT:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedType<short>>
                       (seed,count,componentCount,stride,primitive,
                        (WrappedType<short>)min_00.m_value,(WrappedType<short>)max_00.m_value);
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                       (seed,count,componentCount,stride,primitive,
                        (WrappedType<unsigned_char>)min.field_1._0_1_,
                        (WrappedType<unsigned_char>)max.field_1._0_1_);
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                       (seed,count,componentCount,stride,primitive,
                        (WrappedType<unsigned_short>)min_00.m_value,
                        (WrappedType<unsigned_short>)max_00.m_value);
    break;
  case INPUTTYPE_INT:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedType<int>>
                       (seed,count,componentCount,stride,primitive,
                        (WrappedType<int>)min.field_1.fl.m_value,
                        (WrappedType<int>)max.field_1.fl.m_value);
    break;
  case INPUTTYPE_UNSIGNED_INT:
    pcVar1 = createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_int>>
                       (seed,count,componentCount,stride,primitive,
                        (WrappedType<unsigned_int>)min.field_1.fl.m_value,
                        (WrappedType<unsigned_int>)max.field_1.fl.m_value);
    break;
  case INPUTTYPE_HALF:
    pcVar1 = createPerQuads<deqp::gls::GLValue::Half>
                       (seed,count,componentCount,stride,primitive,min_00,max_00);
    break;
  default:
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

char* RandomArrayGenerator::generatePerQuad (int seed, int count, int componentCount, int stride, Array::Primitive primitive, Array::InputType type, GLValue min, GLValue max)
{
	char* data = DE_NULL;

	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
			data = createPerQuads<GLValue::Float>(seed, count, componentCount, stride, primitive, min.fl, max.fl);
			break;

		case Array::INPUTTYPE_FIXED:
			data = createPerQuads<GLValue::Fixed>(seed, count, componentCount, stride, primitive, min.fi, max.fi);
			break;

		case Array::INPUTTYPE_DOUBLE:
			data = createPerQuads<GLValue::Double>(seed, count, componentCount, stride, primitive, min.d, max.d);
			break;

		case Array::INPUTTYPE_BYTE:
			data = createPerQuads<GLValue::Byte>(seed, count, componentCount, stride, primitive, min.b, max.b);
			break;

		case Array::INPUTTYPE_SHORT:
			data = createPerQuads<GLValue::Short>(seed, count, componentCount, stride, primitive, min.s, max.s);
			break;

		case Array::INPUTTYPE_UNSIGNED_BYTE:
			data = createPerQuads<GLValue::Ubyte>(seed, count, componentCount, stride, primitive, min.ub, max.ub);
			break;

		case Array::INPUTTYPE_UNSIGNED_SHORT:
			data = createPerQuads<GLValue::Ushort>(seed, count, componentCount, stride, primitive, min.us, max.us);
			break;

		case Array::INPUTTYPE_UNSIGNED_INT:
			data = createPerQuads<GLValue::Uint>(seed, count, componentCount, stride, primitive, min.ui, max.ui);
			break;

		case Array::INPUTTYPE_INT:
			data = createPerQuads<GLValue::Int>(seed, count, componentCount, stride, primitive, min.i, max.i);
			break;

		case Array::INPUTTYPE_HALF:
			data = createPerQuads<GLValue::Half>(seed, count, componentCount, stride, primitive, min.h, max.h);
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return data;
}